

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void MOJOSHADER_effectSetRawValueName
               (MOJOSHADER_effect *effect,char *name,void *data,uint offset,uint len)

{
  MOJOSHADER_effectParam *pMVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(uint)effect->param_count;
  if (effect->param_count < 1) {
    uVar4 = 0;
  }
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar4 * 0x50 + 0x50 == uVar5 + 0x50) {
      __assert_fail("0 && \"Effect parameter not found!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x693,
                    "void MOJOSHADER_effectSetRawValueName(const MOJOSHADER_effect *, const char *, const void *, const unsigned int, const unsigned int)"
                   );
    }
    pMVar1 = effect->params;
    iVar3 = strcmp(name,*(char **)((long)&(pMVar1->value).name + uVar5));
    uVar2 = uVar5 + 0x50;
  } while (iVar3 != 0);
  memcpy((void *)((ulong)offset + *(long *)((long)&(pMVar1->value).field_4 + uVar5)),data,(ulong)len
        );
  return;
}

Assistant:

void MOJOSHADER_effectSetRawValueName(const MOJOSHADER_effect *effect,
                                      const char *name,
                                      const void *data,
                                      const unsigned int offset,
                                      const unsigned int len)
{
    int i;
    for (i = 0; i < effect->param_count; i++)
    {
        if (strcmp(name, effect->params[i].value.name) == 0)
        {
            // !!! FIXME: char* case is arbitary, for Win32 -flibit
            memcpy((char *) effect->params[i].value.values + offset, data, len);
            return;
        } // if
    } // for
    assert(0 && "Effect parameter not found!");
}